

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fImplementationLimitTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange>::iterate
          (LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange> *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *description;
  FloatRange value;
  float v [2];
  FloatRange local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  FloatRange local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a0 [384];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1a0._0_4_ = -1.0;
  local_1a0._4_4_ = -1.0;
  (**(code **)(CONCAT44(extraout_var_00,iVar5) + 0x818))(this->m_limit,local_1a0);
  local_1b8.min = (float)local_1a0._0_4_;
  local_1b8.max = (float)local_1a0._4_4_;
  uStack_1b0 = 0;
  local_1e0.min = (float)local_1a0._0_4_;
  local_1e0.max = (float)local_1a0._4_4_;
  err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(err,"Query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fImplementationLimitTests.cpp"
                  ,0xf4);
  local_1c8 = ZEXT416((uint)(this->m_minRequiredValue).max);
  local_1d8 = ZEXT416((uint)(this->m_minRequiredValue).min);
  local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Reported: ",10);
  LimitQuery::operator<<((ostream *)poVar1,&local_1e0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Minimum required: ",0x12);
  LimitQuery::operator<<((ostream *)poVar1,&this->m_minRequiredValue);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  bVar2 = (float)local_1d8._0_4_ < local_1b8.min;
  bVar3 = local_1b8.max < (float)local_1c8._0_4_;
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  if (bVar2 || bVar3) {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"FAIL: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"reported range does not contain the minimum required range!",0x3b)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
    description = "Requirement not satisfied";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar2 || bVar3),
             description);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		const T					value	= query<T>(m_context.getRenderContext().getFunctions(), m_limit);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		const bool isOk = compare<T>(m_minRequiredValue, value);

		m_testCtx.getLog() << TestLog::Message << "Reported: " << value << TestLog::EndMessage;
		m_testCtx.getLog() << TestLog::Message << "Minimum required: " << m_minRequiredValue << TestLog::EndMessage;

		if (!isOk)
			m_testCtx.getLog() << TestLog::Message << "FAIL: " << QueryClassTraits<(QueryClass)QueryTypeTraits<T>::CLASS>::s_errorDescription << TestLog::EndMessage;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Requirement not satisfied");
		return STOP;
	}